

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

SimpleString getExceptionTypeName(exception *e)

{
  pointer __p;
  size_t extraout_RDX;
  long *in_RSI;
  SimpleString SVar1;
  char *local_68;
  _func_void_void_ptr *local_40;
  undefined1 local_38 [8];
  unique_ptr<char,_void_(*)(void_*)> demangledName;
  int status;
  char *name;
  exception *e_local;
  
  local_68 = std::type_info::name(*(type_info **)(*in_RSI + -8));
  demangledName._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>._M_head_impl
  ._4_4_ = -1;
  __p = (pointer)__cxa_demangle(local_68,0,0,
                                (undefined1 *)
                                ((long)&demangledName._M_t.
                                        super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                                        super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                                        super__Head_base<0UL,_char_*,_false>._M_head_impl + 4));
  local_40 = free;
  std::unique_ptr<char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<char,void(*)(void*)> *)local_38,__p,&local_40);
  if (demangledName._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
      _M_head_impl._4_4_ == 0) {
    local_68 = std::unique_ptr<char,_void_(*)(void_*)>::get
                         ((unique_ptr<char,_void_(*)(void_*)> *)local_38);
  }
  SimpleString::SimpleString((SimpleString *)e,local_68);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<char,_void_(*)(void_*)> *)local_38);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)e;
  return SVar1;
}

Assistant:

static SimpleString getExceptionTypeName(const std::exception &e)
{
    const char *name = typeid(e).name();
#if defined(__GNUC__) && (__cplusplus >= 201103L)
    int status = -1;

    std::unique_ptr<char, void(*)(void*)> demangledName(
        abi::__cxa_demangle(name, NULLPTR, NULLPTR, &status),
        std::free );

    return (status==0) ? demangledName.get() : name;
#else
    return name;
#endif
}